

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ProjectionLight::Projection(ProjectionLight *this,Vector3f *wl,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  RGB *pRVar7;
  int c;
  int c_00;
  float fVar8;
  float fVar9;
  float z;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [56];
  undefined8 uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar17 [56];
  float y;
  SampledSpectrum SVar18;
  RGB rgb;
  RGB local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  SampledWavelengths *local_70;
  undefined1 local_68 [16];
  RGBSpectrum local_58;
  undefined1 auVar16 [64];
  
  fVar1 = (wl->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar14 = 0;
  auVar12 = ZEXT416((uint)fVar1);
  if (fVar1 < this->hither) {
    return (array<float,_4>)ZEXT816(0);
  }
  fVar1 = (wl->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar9 = (wl->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->ScreenFromLight).m.m[0][1])),
                            ZEXT416((uint)fVar9),ZEXT416((uint)(this->ScreenFromLight).m.m[0][0]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->ScreenFromLight).m.m[3][1])),
                           ZEXT416((uint)fVar9),ZEXT416((uint)(this->ScreenFromLight).m.m[3][0]));
  auVar11 = vfmadd231ss_fma(auVar11,auVar12,ZEXT416((uint)(this->ScreenFromLight).m.m[0][2]));
  auVar6 = vfmadd231ss_fma(auVar6,auVar12,ZEXT416((uint)(this->ScreenFromLight).m.m[3][2]));
  fVar4 = auVar6._0_4_ + (this->ScreenFromLight).m.m[3][3];
  fVar5 = auVar11._0_4_ + (this->ScreenFromLight).m.m[0][3];
  bVar3 = fVar4 == 1.0;
  fVar8 = (float)((uint)bVar3 * (int)fVar5 + (uint)!bVar3 * (int)(fVar5 / fVar4));
  fVar5 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.x;
  if ((fVar5 <= fVar8) &&
     (fVar2 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x, fVar8 <= fVar2)) {
    auVar11 = vfmadd132ss_fma(ZEXT416((uint)fVar9),
                              ZEXT416((uint)(fVar1 * (this->ScreenFromLight).m.m[1][1])),
                              ZEXT416((uint)(this->ScreenFromLight).m.m[1][0]));
    auVar12 = vfmadd132ss_fma(auVar12,auVar11,ZEXT416((uint)(this->ScreenFromLight).m.m[1][2]));
    fVar1 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.y;
    fVar9 = auVar12._0_4_ + (this->ScreenFromLight).m.m[1][3];
    fVar9 = (float)((uint)bVar3 * (int)fVar9 + (uint)!bVar3 * (int)(fVar9 / fVar4));
    if (fVar1 <= fVar9) {
      fVar4 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y;
      auVar12._0_8_ = 0;
      if (fVar9 <= fVar4) {
        _local_88 = vinsertps_avx(ZEXT416((uint)(fVar8 - fVar5)),ZEXT416((uint)(fVar9 - fVar1)),0x10
                                 );
        if (fVar5 < fVar2) {
          register0x00001304 = local_88._4_12_;
          local_88._0_4_ = (fVar8 - fVar5) / (fVar2 - fVar5);
        }
        auVar15 = ZEXT464(0);
        if (fVar1 < fVar4) {
          auVar12 = vmovshdup_avx(_local_88);
          auVar15 = ZEXT1664(auVar12);
          auVar11._0_4_ = auVar12._0_4_ / (fVar4 - fVar1);
          auVar11._4_12_ = auVar12._4_12_;
          _local_88 = vinsertps_avx(_local_88,auVar11,0x10);
        }
        local_68 = vmovshdup_avx(_local_88);
        c_00 = 0;
        local_98.r = 0.0;
        local_98.g = 0.0;
        local_98.b = 0.0;
        local_70 = lambda;
        do {
          wl = (Vector3f *)
               (CONCAT44(SUB84(wl,4),
                         (int)(local_88._0_4_ *
                              (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x)) |
               (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y
                                 * (float)local_68._0_4_) << 0x20);
          FVar10 = Image::GetChannel(&this->image,(Point2i)wl,c_00,(WrapMode2D)0x200000002);
          auVar17 = auVar15._8_56_;
          pRVar7 = &local_98;
          if ((c_00 != 0) && (pRVar7 = (RGB *)&local_98.g, c_00 != 1)) {
            pRVar7 = (RGB *)&local_98.b;
          }
          c_00 = c_00 + 1;
          pRVar7->r = FVar10;
        } while (c_00 != 3);
        FVar10 = this->scale;
        local_88._4_4_ = FVar10;
        local_88._0_4_ = FVar10;
        fStack_80 = FVar10;
        fStack_7c = FVar10;
        auVar13 = ZEXT856(local_88._8_8_);
        RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,&local_98);
        SVar18 = RGBSpectrum::Sample(&local_58,local_70);
        auVar16._0_8_ = SVar18.values.values._8_8_;
        auVar16._8_56_ = auVar17;
        auVar15._0_8_ = SVar18.values.values._0_8_;
        auVar15._8_56_ = auVar13;
        auVar11 = vmovlhps_avx(auVar15._0_16_,auVar16._0_16_);
        auVar12._0_8_ =
             CONCAT44(auVar11._4_4_ * (float)local_88._4_4_,auVar11._0_4_ * (float)local_88._0_4_);
        auVar12._8_4_ = auVar11._8_4_ * fStack_80;
        auVar12._12_4_ = auVar11._12_4_ * fStack_7c;
        auVar11 = vshufpd_avx(auVar12,auVar12,1);
        uVar14 = auVar11._0_8_;
      }
      goto LAB_003c2197;
    }
  }
  auVar12._0_8_ = 0;
LAB_003c2197:
  SVar18.values.values[2] = (float)(int)uVar14;
  SVar18.values.values[3] = (float)(int)((ulong)uVar14 >> 0x20);
  SVar18.values.values[0] = (float)(int)auVar12._0_8_;
  SVar18.values.values[1] = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
  return (SampledSpectrum)SVar18.values.values;
}

Assistant:

SampledSpectrum ProjectionLight::Projection(const Vector3f &wl,
                                            const SampledWavelengths &lambda) const {
    // Discard directions behind projection light
    if (wl.z < hither)
        return SampledSpectrum(0.);

    // Project point onto projection plane and compute RGB
    Point3f ps = ScreenFromLight(Point3f(wl.x, wl.y, wl.z));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds))
        return SampledSpectrum(0.f);
    Point2f st = Point2f(screenBounds.Offset(Point2f(ps.x, ps.y)));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);

    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}